

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void __thiscall diy::mpi::io::file::file(file *this,communicator *comm__,string *filename,int mode)

{
  MPI_Comm poVar1;
  MPI_Comm *ppoVar2;
  undefined8 uVar3;
  MPI_File *ppoVar4;
  runtime_error *this_00;
  undefined4 in_ECX;
  communicator *in_RSI;
  communicator *in_RDI;
  int ret;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar5;
  char *in_stack_ffffffffffffffa8;
  DIY_MPI_Comm local_28;
  int local_20;
  undefined4 local_1c;
  communicator *local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  communicator::communicator(in_RDI,in_RSI);
  local_28 = communicator::handle(local_10);
  ppoVar2 = mpi_cast(&local_28);
  poVar1 = *ppoVar2;
  uVar3 = std::__cxx11::string::c_str();
  ppoVar4 = mpi_cast((DIY_MPI_File *)(in_RDI + 1));
  local_20 = MPI_File_open(poVar1,uVar3,local_1c,&ompi_mpi_info_null,ppoVar4);
  if (local_20 != 0) {
    uVar5 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffa8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar5,in_stack_ffffffffffffffa0));
    std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffa8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

diy::mpi::io::file::
file(const communicator& comm__, const std::string& filename, int mode)
: comm_(comm__)
{
#if DIY_HAS_MPI
  int ret = MPI_File_open(diy::mpi::mpi_cast(comm__.handle()), const_cast<char*>(filename.c_str()), mode, MPI_INFO_NULL, &diy::mpi::mpi_cast(fh));
  if (ret)
      throw std::runtime_error("DIY cannot open file: " + filename);
#else
  (void)comm__; (void)filename; (void)mode;
  DIY_UNSUPPORTED_MPI_CALL(MPI_File_open);
#endif
}